

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

int stbiw__jpg_processDU
              (stbi__write_context *s,int *bitBuf,int *bitCnt,float *CDU,float *fdtbl,int DC,
              unsigned_short (*HTDC) [2],unsigned_short (*HTAC) [2])

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  unsigned_short *bs;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  float *d0p;
  uint uVar13;
  int DU [64];
  
  uVar1 = (*HTAC)[0];
  uVar2 = HTAC[0xf0][0];
  uVar8 = 0xfffffffffffffff8;
  d0p = CDU;
  do {
    stbiw__jpg_DCT(d0p,d0p + 1,d0p + 2,d0p + 3,d0p + 4,d0p + 5,d0p + 6,d0p + 7);
    uVar8 = uVar8 + 8;
    d0p = d0p + 8;
  } while (uVar8 < 0x38);
  lVar9 = 0;
  do {
    stbiw__jpg_DCT((float *)(lVar9 + (long)CDU),(float *)((long)CDU + lVar9 + 0x20),
                   (float *)((long)CDU + lVar9 + 0x40),(float *)((long)CDU + lVar9 + 0x60),
                   (float *)((long)CDU + lVar9 + 0x80),(float *)((long)CDU + lVar9 + 0xa0),
                   (float *)((long)CDU + lVar9 + 0xc0),(float *)((long)CDU + lVar9 + 0xe0));
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x20);
  lVar9 = 0;
  do {
    DU[""[lVar9]] =
         (int)(CDU[lVar9] * fdtbl[lVar9] +
              *(float *)(&DAT_001b1910 + (ulong)(CDU[lVar9] * fdtbl[lVar9] < 0.0) * 4));
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x40);
  uVar5 = DU[0] - DC;
  if (uVar5 == 0) {
    bs = (unsigned_short *)(ulong)(*HTDC)[0];
  }
  else {
    uVar6 = -uVar5;
    if (0 < (int)uVar5) {
      uVar6 = uVar5;
    }
    uVar13 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> uVar13 == 0; uVar13 = uVar13 - 1) {
      }
    }
    uVar10 = 1;
    if (1 < uVar6) {
      uVar10 = (uVar13 ^ 0xffffffe0) + 0x21;
    }
    stbiw__jpg_writeBits(s,bitBuf,bitCnt,(unsigned_short *)(ulong)HTDC[uVar10 & 0xff][0]);
    bs = (unsigned_short *)(ulong)(~(-1 << ((byte)uVar10 & 0x1f)) & ((int)uVar5 >> 0x1f) + uVar5);
  }
  stbiw__jpg_writeBits(s,bitBuf,bitCnt,bs);
  uVar8 = 0x40;
  while( true ) {
    iVar4 = (int)uVar8;
    uVar5 = iVar4 - 1;
    uVar8 = (ulong)uVar5;
    if (DU[uVar8] != 0) break;
    if (uVar5 < 2) goto LAB_0015908d;
  }
  if ((int)uVar5 < 1) goto LAB_0015908d;
  iVar7 = 1;
  do {
    lVar9 = (long)iVar7;
    uVar13 = 0xffffffff;
    uVar6 = 0;
    do {
      uVar11 = uVar6;
      uVar10 = DU[lVar9];
      uVar13 = uVar13 + 1;
      if ((long)uVar8 < lVar9) break;
      lVar9 = lVar9 + 1;
      uVar6 = uVar11 + 1;
    } while (uVar10 == 0);
    uVar6 = uVar13;
    if (0xf < (int)uVar13) {
      uVar11 = uVar11 >> 4;
      iVar12 = uVar11 + (uVar11 == 0);
      do {
        stbiw__jpg_writeBits(s,bitBuf,bitCnt,(unsigned_short *)(ulong)uVar2);
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
      uVar6 = uVar13 & 0xf;
    }
    uVar11 = -uVar10;
    if (0 < (int)uVar10) {
      uVar11 = uVar10;
    }
    uVar3 = 0x1f;
    if (uVar11 != 0) {
      for (; uVar11 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar3 = (uVar3 ^ 0xffffffe0) + 0x21;
    if (uVar11 < 2) {
      uVar3 = 1;
    }
    iVar12 = iVar7 + uVar13;
    stbiw__jpg_writeBits
              (s,bitBuf,bitCnt,
               (unsigned_short *)(ulong)HTAC[(int)(uVar6 * 0x10 + (uVar3 & 0xff))][0]);
    stbiw__jpg_writeBits
              (s,bitBuf,bitCnt,
               (unsigned_short *)
               (ulong)(~(-1 << ((byte)uVar3 & 0x1f)) & ((int)uVar10 >> 0x1f) + uVar10));
    iVar7 = iVar7 + uVar13 + 1;
  } while (iVar12 < (int)uVar5);
  if (iVar4 != 0x40) {
LAB_0015908d:
    stbiw__jpg_writeBits(s,bitBuf,bitCnt,(unsigned_short *)(ulong)uVar1);
  }
  return DU[0];
}

Assistant:

static int stbiw__jpg_processDU(stbi__write_context *s, int *bitBuf, int *bitCnt, float *CDU, float *fdtbl, int DC, const unsigned short HTDC[256][2], const unsigned short HTAC[256][2]) {
   const unsigned short EOB[2] = { HTAC[0x00][0], HTAC[0x00][1] };
   const unsigned short M16zeroes[2] = { HTAC[0xF0][0], HTAC[0xF0][1] };
   int dataOff, i, diff, end0pos;
   int DU[64];

   // DCT rows
   for(dataOff=0; dataOff<64; dataOff+=8) {
      stbiw__jpg_DCT(&CDU[dataOff], &CDU[dataOff+1], &CDU[dataOff+2], &CDU[dataOff+3], &CDU[dataOff+4], &CDU[dataOff+5], &CDU[dataOff+6], &CDU[dataOff+7]);
   }
   // DCT columns
   for(dataOff=0; dataOff<8; ++dataOff) {
      stbiw__jpg_DCT(&CDU[dataOff], &CDU[dataOff+8], &CDU[dataOff+16], &CDU[dataOff+24], &CDU[dataOff+32], &CDU[dataOff+40], &CDU[dataOff+48], &CDU[dataOff+56]);
   }
   // Quantize/descale/zigzag the coefficients
   for(i=0; i<64; ++i) {
      float v = CDU[i]*fdtbl[i];
      // DU[stbiw__jpg_ZigZag[i]] = (int)(v < 0 ? ceilf(v - 0.5f) : floorf(v + 0.5f));
      // ceilf() and floorf() are C99, not C89, but I /think/ they're not needed here anyway?
      DU[stbiw__jpg_ZigZag[i]] = (int)(v < 0 ? v - 0.5f : v + 0.5f);
   }

   // Encode DC
   diff = DU[0] - DC;
   if (diff == 0) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTDC[0]);
   } else {
      unsigned short bits[2];
      stbiw__jpg_calcBits(diff, bits);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTDC[bits[1]]);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, bits);
   }
   // Encode ACs
   end0pos = 63;
   for(; (end0pos>0)&&(DU[end0pos]==0); --end0pos) {
   }
   // end0pos = first element in reverse order !=0
   if(end0pos == 0) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, EOB);
      return DU[0];
   }
   for(i = 1; i <= end0pos; ++i) {
      int startpos = i;
      int nrzeroes;
      unsigned short bits[2];
      for (; DU[i]==0 && i<=end0pos; ++i) {
      }
      nrzeroes = i-startpos;
      if ( nrzeroes >= 16 ) {
         int lng = nrzeroes>>4;
         int nrmarker;
         for (nrmarker=1; nrmarker <= lng; ++nrmarker)
            stbiw__jpg_writeBits(s, bitBuf, bitCnt, M16zeroes);
         nrzeroes &= 15;
      }
      stbiw__jpg_calcBits(DU[i], bits);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTAC[(nrzeroes<<4)+bits[1]]);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, bits);
   }
   if(end0pos != 63) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, EOB);
   }
   return DU[0];
}